

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O1

int do_esc_char(uint32_t c,unsigned_long flags,char *do_quotes,BIO *out,int is_first,int is_last)

{
  int len;
  int iVar1;
  int iVar2;
  ulong uVar4;
  char *__format;
  uchar u8;
  char buf [16];
  byte local_29;
  char local_28 [24];
  size_t sVar3;
  
  uVar4 = (ulong)c;
  local_29 = (byte)c;
  if (c < 0x10000) {
    if (c < 0x100) {
      if ((c < 0x80 || (flags & 4) == 0) &&
         (((flags & 2) == 0 || (0x1f < local_29 && local_29 != 0x7f)))) {
        if ((flags & 1) == 0) {
          if (c != 0x5c || (flags & 0xe) == 0) goto LAB_00311688;
          __format = "\\%c";
          uVar4 = 0x5c;
        }
        else {
          if ((local_29 != 0x5c) && ((c & 0xff) != 0x22)) {
            if (((((c & 0xfd) != 0x3c) &&
                 ((0x3b < local_29 || ((0x800180000000000U >> (uVar4 & 0x3f) & 1) == 0)))) &&
                ((is_first == 0 || ((local_29 != 0x20 && ((c & 0xff) != 0x23)))))) &&
               (c != 0x20 || is_last == 0)) {
LAB_00311688:
              if (out != (BIO *)0x0) {
                iVar2 = BIO_write((BIO *)out,&local_29,1);
                return (uint)(iVar2 == 1) * 2 + -1;
              }
              return 1;
            }
            if ((flags & 8) != 0) {
              if (do_quotes != (char *)0x0) {
                *do_quotes = '\x01';
              }
              goto LAB_00311688;
            }
          }
          __format = "\\%c";
        }
      }
      else {
        __format = "\\%02X";
      }
    }
    else {
      __format = "\\U%04X";
    }
  }
  else {
    __format = "\\W%08X";
  }
  snprintf(local_28,0x10,__format,uVar4);
  sVar3 = strlen(local_28);
  len = (int)sVar3;
  iVar2 = len;
  if (out != (BIO *)0x0) {
    iVar1 = BIO_write((BIO *)out,local_28,len);
    iVar2 = -1;
    if (iVar1 == len) {
      iVar2 = len;
    }
  }
  return iVar2;
}

Assistant:

static int do_esc_char(uint32_t c, unsigned long flags, char *do_quotes,
                       BIO *out, int is_first, int is_last) {
  // |c| is a |uint32_t| because, depending on |ASN1_STRFLGS_UTF8_CONVERT|,
  // we may be escaping bytes or Unicode codepoints.
  char buf[16];  // Large enough for "\\W01234567".
  unsigned char u8 = (unsigned char)c;
  if (c > 0xffff) {
    snprintf(buf, sizeof(buf), "\\W%08" PRIX32, c);
  } else if (c > 0xff) {
    snprintf(buf, sizeof(buf), "\\U%04" PRIX32, c);
  } else if ((flags & ASN1_STRFLGS_ESC_MSB) && c > 0x7f) {
    snprintf(buf, sizeof(buf), "\\%02X", c);
  } else if ((flags & ASN1_STRFLGS_ESC_CTRL) && is_control_character(c)) {
    snprintf(buf, sizeof(buf), "\\%02X", c);
  } else if (flags & ASN1_STRFLGS_ESC_2253) {
    // See RFC 2253, sections 2.4 and 4.
    if (c == '\\' || c == '"') {
      // Quotes and backslashes are always escaped, quoted or not.
      snprintf(buf, sizeof(buf), "\\%c", (int)c);
    } else if (c == ',' || c == '+' || c == '<' || c == '>' || c == ';' ||
               (is_first && (c == ' ' || c == '#')) ||
               (is_last && (c == ' '))) {
      if (flags & ASN1_STRFLGS_ESC_QUOTE) {
        // No need to escape, just tell the caller to quote.
        if (do_quotes != NULL) {
          *do_quotes = 1;
        }
        return maybe_write(out, &u8, 1) ? 1 : -1;
      }
      snprintf(buf, sizeof(buf), "\\%c", (int)c);
    } else {
      return maybe_write(out, &u8, 1) ? 1 : -1;
    }
  } else if ((flags & ESC_FLAGS) && c == '\\') {
    // If any escape flags are set, also escape backslashes.
    snprintf(buf, sizeof(buf), "\\%c", (int)c);
  } else {
    return maybe_write(out, &u8, 1) ? 1 : -1;
  }

  static_assert(sizeof(buf) < INT_MAX, "len may not fit in int");
  int len = (int)strlen(buf);
  return maybe_write(out, buf, len) ? len : -1;
}